

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O3

int ExUtilGetInts(char *v,int base,int max_output,int *output)

{
  uint in_EAX;
  uint32_t uVar1;
  char *pcVar2;
  ulong uVar3;
  int error;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar3 = 0;
  if (0 < max_output && v != (char *)0x0) {
    uVar3 = 0;
    while( true ) {
      uVar1 = ExUtilGetUInt(v,base,(int *)((long)&uStack_38 + 4));
      if (uStack_38._4_4_ != 0) break;
      output[uVar3] = uVar1;
      pcVar2 = strchr(v,0x2c);
      v = pcVar2 + 1;
      uVar3 = uVar3 + 1;
      if ((pcVar2 == (char *)0x0) || ((uint)max_output <= uVar3)) goto LAB_00103786;
    }
    uVar3 = 0xffffffff;
  }
LAB_00103786:
  return (int)uVar3;
}

Assistant:

int ExUtilGetInts(const char* v, int base, int max_output, int output[]) {
  int n, error = 0;
  for (n = 0; v != NULL && n < max_output; ++n) {
    const int value = ExUtilGetInt(v, base, &error);
    if (error) return -1;
    output[n] = value;
    v = strchr(v, ',');
    if (v != NULL) ++v;   // skip over the trailing ','
  }
  return n;
}